

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O2

bool __thiscall
helics::InterfaceInfo::setEndpointProperty
          (InterfaceInfo *this,InterfaceHandle hid,int32_t option,int32_t value)

{
  EndpointInfo *this_00;
  
  this_00 = getEndpoint(this,hid);
  if (this_00 != (EndpointInfo *)0x0) {
    EndpointInfo::setProperty(this_00,option,value);
    EndpointInfo::setProperty(this_00,option,value);
  }
  return this_00 != (EndpointInfo *)0x0;
}

Assistant:

bool InterfaceInfo::setEndpointProperty(InterfaceHandle hid, int32_t option, int32_t value)
{
    auto* ept = getEndpoint(hid);
    if (ept == nullptr) {
        return false;
    }
    ept->setProperty(option, value);
    ept->setProperty(option, value);
    return true;
}